

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitLocalGet(FunctionValidator *this,LocalGet *curr)

{
  uint uVar1;
  bool bVar2;
  size_t sVar3;
  Type TVar4;
  
  ValidationInfo::shouldBeTrue<wasm::LocalGet*>
            (this->info,
             1 < (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id,
             curr,
             "local.get must have a valid type - check what you provided when you constructed the node"
             ,(this->
              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
              ).
              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
              .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
              currFunction);
  uVar1 = curr->index;
  sVar3 = Function::getNumLocals
                    ((this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  bVar2 = ValidationInfo::shouldBeTrue<wasm::LocalGet*>
                    (this->info,uVar1 < sVar3,curr,"local.get index must be small enough",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (bVar2) {
    TVar4 = Function::getLocalType
                      ((this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction,curr->index);
    ValidationInfo::shouldBeTrue<wasm::LocalGet*>
              (this->info,
               (curr->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id ==
               TVar4.id,curr,"local.get must have proper type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    return;
  }
  return;
}

Assistant:

void FunctionValidator::visitLocalGet(LocalGet* curr) {
  shouldBeTrue(curr->type.isConcrete(),
               curr,
               "local.get must have a valid type - check what you provided "
               "when you constructed the node");
  if (shouldBeTrue(curr->index < getFunction()->getNumLocals(),
                   curr,
                   "local.get index must be small enough")) {
    shouldBeTrue(curr->type == getFunction()->getLocalType(curr->index),
                 curr,
                 "local.get must have proper type");
  }
}